

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_opaque_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::InlineOpaquePass::IsOpaqueType(InlineOpaquePass *this,uint32_t typeId)

{
  Op OVar1;
  bool bVar2;
  DefUseManager *this_00;
  Instruction *this_01;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  while( true ) {
    this_00 = Pass::get_def_use_mgr((Pass *)this);
    this_01 = analysis::DefUseManager::GetDef(this_00,typeId);
    OVar1 = this_01->opcode_;
    if (OVar1 != OpTypePointer) break;
    typeId = Instruction::GetSingleWordInOperand(this_01,1);
  }
  if (OVar1 - OpTypeImage < 3) {
    bVar2 = true;
  }
  else if (OVar1 == OpTypeStruct) {
    local_38._8_8_ = 0;
    local_20 = std::
               _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_opaque_pass.cpp:43:35)>
               ::_M_invoke;
    local_28 = std::
               _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_opaque_pass.cpp:43:35)>
               ::_M_manager;
    local_38._M_unused._M_object = this;
    bVar2 = Instruction::WhileEachInId(this_01,(function<bool_(const_unsigned_int_*)> *)&local_38);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
    bVar2 = !bVar2;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool InlineOpaquePass::IsOpaqueType(uint32_t typeId) {
  const Instruction* typeInst = get_def_use_mgr()->GetDef(typeId);
  switch (typeInst->opcode()) {
    case spv::Op::OpTypeSampler:
    case spv::Op::OpTypeImage:
    case spv::Op::OpTypeSampledImage:
      return true;
    case spv::Op::OpTypePointer:
      return IsOpaqueType(
          typeInst->GetSingleWordInOperand(kTypePointerTypeIdInIdx));
    default:
      break;
  }
  // TODO(greg-lunarg): Handle arrays containing opaque type
  if (typeInst->opcode() != spv::Op::OpTypeStruct) return false;
  // Return true if any member is opaque
  return !typeInst->WhileEachInId([this](const uint32_t* tid) {
    if (IsOpaqueType(*tid)) return false;
    return true;
  });
}